

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void processIncludeDirectories
               (cmTarget *tgt,
               vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *includes,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueIncludes,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugIncludes,string *language)

{
  cmLinkImplItem *pcVar1;
  MessageType MVar2;
  bool bVar3;
  PolicyStatus PVar4;
  cmMakefile *mf_00;
  reference ppTVar5;
  cmCompiledGeneratorExpression *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  reference pbVar9;
  cmMakefile *pcVar10;
  ulong uVar11;
  cmake *this;
  string *psVar12;
  PolicyID id;
  PolicyID id_00;
  bool local_5a1;
  cmListFileBacktrace local_5a0;
  allocator local_569;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_4a8;
  undefined1 local_490 [8];
  string inc;
  string local_450;
  MessageType local_430;
  byte local_429;
  MessageType messageType_1;
  bool noMessage;
  ostringstream e_1;
  string local_2a8;
  string local_288;
  MessageType local_264;
  undefined1 local_260 [4];
  MessageType messageType;
  ostringstream e;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  iterator li;
  string usedIncludes;
  string local_a8;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryIncludes;
  bool checkCMP0027;
  bool fromImported;
  string *targetName;
  cmLinkImplItem *item;
  const_iterator end;
  const_iterator it;
  cmMakefile *mf;
  bool debugIncludes_local;
  string *config_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *uniqueIncludes_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includes_local;
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  *entries_local;
  cmTarget *tgt_local;
  
  mf_00 = cmTarget::GetMakefile(tgt);
  end = std::
        vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ::begin(entries);
  item = (cmLinkImplItem *)
         std::
         vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
         ::end(entries);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
                             *)&item);
    if (!bVar3) {
      return;
    }
    ppTVar5 = __gnu_cxx::
              __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
              ::operator*(&end);
    pcVar1 = (*ppTVar5)->LinkImplItem;
    local_5a1 = false;
    if ((pcVar1->super_cmLinkItem).Target != (cmTarget *)0x0) {
      local_5a1 = cmTarget::IsImported((pcVar1->super_cmLinkItem).Target);
    }
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_5a1;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = pcVar1->FromGenex & 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88);
    ppTVar5 = __gnu_cxx::
              __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
              ::operator*(&end);
    pcVar6 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar5)->ge);
    pcVar7 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar6,mf_00,config,false,tgt,dagChecker,language);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a8,pcVar7,(allocator *)(usedIncludes.field_2._M_local_buf + 0xb));
    cmSystemTools::ExpandListArgument
              (&local_a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88,false);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)(usedIncludes.field_2._M_local_buf + 0xb));
    std::__cxx11::string::string((string *)&li);
    local_e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_88);
    while( true ) {
      local_e8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_88);
      bVar3 = __gnu_cxx::operator!=(&local_e0,&local_e8);
      if (!bVar3) break;
      if ((entryIncludes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_e0);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        bVar3 = cmsys::SystemTools::FileExists(pcVar7);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
          local_264 = FATAL_ERROR;
          if ((entryIncludes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
            PVar4 = cmTarget::GetPolicyStatusCMP0027(tgt);
            if (PVar4 != OLD) {
              if (PVar4 != WARN) goto LAB_006eeed3;
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_288,(cmPolicies *)0x1b,id);
              poVar8 = std::operator<<((ostream *)local_260,(string *)&local_288);
              std::operator<<(poVar8,"\n");
              std::__cxx11::string::~string((string *)&local_288);
            }
            local_264 = AUTHOR_WARNING;
          }
LAB_006eeed3:
          poVar8 = std::operator<<((ostream *)local_260,"Imported target \"");
          poVar8 = std::operator<<(poVar8,(string *)pcVar1);
          poVar8 = std::operator<<(poVar8,"\" includes non-existent path\n  \"");
          pbVar9 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_e0);
          poVar8 = std::operator<<(poVar8,(string *)pbVar9);
          std::operator<<(poVar8,
                          "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                         );
          pcVar10 = cmTarget::GetMakefile(tgt);
          MVar2 = local_264;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar10,MVar2,&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          bVar3 = true;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
          goto LAB_006ef6dc;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_e0);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar3 = cmsys::SystemTools::FileIsFullPath(pcVar7);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&messageType_1);
        local_429 = 0;
        local_430 = FATAL_ERROR;
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          poVar8 = std::operator<<((ostream *)&messageType_1,"Target \"");
          poVar8 = std::operator<<(poVar8,(string *)pcVar1);
          poVar8 = std::operator<<(poVar8,
                                   "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \""
                                  );
          pbVar9 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_e0);
          poVar8 = std::operator<<(poVar8,(string *)pbVar9);
          std::operator<<(poVar8,"\"");
        }
        else {
          PVar4 = cmTarget::GetPolicyStatusCMP0021(tgt);
          if (PVar4 == OLD) {
            local_429 = 1;
          }
          else if (PVar4 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_450,(cmPolicies *)0x15,id_00);
            poVar8 = std::operator<<((ostream *)&messageType_1,(string *)&local_450);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&local_450);
            local_430 = AUTHOR_WARNING;
          }
          poVar8 = std::operator<<((ostream *)&messageType_1,
                                   "Found relative path while evaluating include directories of \"")
          ;
          psVar12 = cmTarget::GetName_abi_cxx11_(tgt);
          poVar8 = std::operator<<(poVar8,(string *)psVar12);
          poVar8 = std::operator<<(poVar8,"\":\n  \"");
          pbVar9 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_e0);
          poVar8 = std::operator<<(poVar8,(string *)pbVar9);
          std::operator<<(poVar8,"\"\n");
        }
        if ((local_429 & 1) == 0) {
          pcVar10 = cmTarget::GetMakefile(tgt);
          MVar2 = local_430;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar10,MVar2,(string *)((long)&inc.field_2 + 8));
          std::__cxx11::string::~string((string *)(inc.field_2._M_local_buf + 8));
          if (local_430 != FATAL_ERROR) goto LAB_006ef306;
          bVar3 = true;
        }
        else {
LAB_006ef306:
          bVar3 = false;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&messageType_1);
        if (bVar3) goto LAB_006ef6dc;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_e0);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar3 = cmSystemTools::IsOff(pcVar7);
      if (!bVar3) {
        pbVar9 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_e0);
        cmsys::SystemTools::ConvertToUnixSlashes(pbVar9);
      }
      pbVar9 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_e0);
      std::__cxx11::string::string((string *)local_490,(string *)pbVar9);
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert(&local_4a8,uniqueIncludes,(value_type *)local_490);
      if (((local_4a8.second & 1U) != 0) &&
         (std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(includes,(value_type *)local_490), debugIncludes)) {
        std::operator+(&local_4e8," * ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_490);
        std::operator+(&local_4c8,&local_4e8,"\n");
        std::__cxx11::string::operator+=((string *)&li,(string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4e8);
      }
      std::__cxx11::string::~string((string *)local_490);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_e0);
    }
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) == 0) {
      this = cmMakefile::GetCMakeInstance(mf_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_568,"Used includes for target ",&local_569);
      psVar12 = cmTarget::GetName_abi_cxx11_(tgt);
      std::operator+(&local_548,&local_568,psVar12);
      std::operator+(&local_528,&local_548,":\n");
      std::operator+(&local_508,&local_528,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&li);
      ppTVar5 = __gnu_cxx::
                __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
                ::operator*(&end);
      pcVar6 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar5)->ge);
      cmCompiledGeneratorExpression::GetBacktrace(&local_5a0,pcVar6);
      cmake::IssueMessage(this,LOG,&local_508,&local_5a0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_5a0);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_568);
      std::allocator<char>::~allocator((allocator<char> *)&local_569);
    }
    bVar3 = false;
LAB_006ef6dc:
    std::__cxx11::string::~string((string *)&li);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_88);
    if (bVar3) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<cmTargetInternals::TargetPropertyEntry_*const_*,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

static void processIncludeDirectories(cmTarget const* tgt,
      const std::vector<cmTargetInternals::TargetPropertyEntry*> &entries,
      std::vector<std::string> &includes,
      UNORDERED_SET<std::string> &uniqueIncludes,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugIncludes,
      const std::string& language)
{
  cmMakefile *mf = tgt->GetMakefile();

  for (std::vector<cmTargetInternals::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    bool const fromImported = item.Target && item.Target->IsImported();
    bool const checkCMP0027 = item.FromGenex;
    std::vector<std::string> entryIncludes;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(mf,
                                              config,
                                              false,
                                              tgt,
                                              dagChecker, language),
                                    entryIncludes);

    std::string usedIncludes;
    for(std::vector<std::string>::iterator
          li = entryIncludes.begin(); li != entryIncludes.end(); ++li)
      {
      if (fromImported
          && !cmSystemTools::FileExists(li->c_str()))
        {
        std::ostringstream e;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (checkCMP0027)
          {
          switch(tgt->GetPolicyStatusCMP0027())
            {
            case cmPolicies::WARN:
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0027) << "\n";
            case cmPolicies::OLD:
              messageType = cmake::AUTHOR_WARNING;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
            }
          }
        e << "Imported target \"" << targetName << "\" includes "
             "non-existent path\n  \"" << *li << "\"\nin its "
             "INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n"
             "* The path was deleted, renamed, or moved to another "
             "location.\n"
             "* An install or uninstall procedure did not complete "
             "successfully.\n"
             "* The installation package was faulty and references files it "
             "does not provide.\n";
        tgt->GetMakefile()->IssueMessage(messageType, e.str());
        return;
        }

      if (!cmSystemTools::FileIsFullPath(li->c_str()))
        {
        std::ostringstream e;
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (!targetName.empty())
          {
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_INCLUDE_DIRECTORIES:\n"
            "  \"" << *li << "\"";
          }
        else
          {
          switch(tgt->GetPolicyStatusCMP0021())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0021) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }
          e << "Found relative path while evaluating include directories of "
          "\"" << tgt->GetName() << "\":\n  \"" << *li << "\"\n";
          }
        if (!noMessage)
          {
          tgt->GetMakefile()->IssueMessage(messageType, e.str());
          if (messageType == cmake::FATAL_ERROR)
            {
            return;
            }
          }
        }

      if (!cmSystemTools::IsOff(li->c_str()))
        {
        cmSystemTools::ConvertToUnixSlashes(*li);
        }
      std::string inc = *li;

      if(uniqueIncludes.insert(inc).second)
        {
        includes.push_back(inc);
        if (debugIncludes)
          {
          usedIncludes += " * " + inc + "\n";
          }
        }
      }
    if (!usedIncludes.empty())
      {
      mf->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used includes for target ")
                            + tgt->GetName() + ":\n"
                            + usedIncludes, (*it)->ge->GetBacktrace());
      }
    }
}